

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testInit
          (XFBInvalidOffsetAlignmentTest *this)

{
  GLuint GVar1;
  vector<gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testCase>_>
  *this_00;
  GLuint stage;
  STAGES SVar2;
  GLuint index;
  GLuint GVar3;
  Type TVar4;
  value_type local_44;
  
  this_00 = &this->m_test_cases;
  for (index = 0; index != 0x22; index = index + 1) {
    TVar4 = TestBase::getType((TestBase *)this,index);
    this = (XFBInvalidOffsetAlignmentTest *)(TVar4._0_8_ & 0xffffffff);
    GVar1 = Utils::Type::GetTypeSize(TVar4.m_basic_type);
    for (SVar2 = COMPUTE; SVar2 != STAGE_MAX; SVar2 = SVar2 + VERTEX) {
      if (SVar2 != FRAGMENT && (SVar2 & FRAGMENT) != COMPUTE) {
        for (GVar3 = 1; GVar1 != GVar3; GVar3 = GVar3 + 1) {
          local_44.m_offset = GVar3 + GVar1;
          this = (XFBInvalidOffsetAlignmentTest *)this_00;
          local_44.m_stage = SVar2;
          local_44.m_type = TVar4;
          std::
          vector<gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testCase>_>
          ::push_back(this_00,&local_44);
        }
      }
    }
  }
  return;
}

Assistant:

void XFBInvalidOffsetAlignmentTest::testInit()
{
	const GLuint n_types = getTypesNumber();

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& type			  = getType(i);
		const GLuint	   base_alingment = Utils::Type::GetTypeSize(type.m_basic_type);

		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			if ((Utils::Shader::COMPUTE == stage) || (Utils::Shader::TESS_CTRL == stage) ||
				(Utils::Shader::FRAGMENT == stage))
			{
				continue;
			}

			for (GLuint offset = base_alingment + 1; offset < 2 * base_alingment; ++offset)
			{
				testCase test_case = { offset, (Utils::Shader::STAGES)stage, type };

				m_test_cases.push_back(test_case);
			}
		}
	}
}